

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_key.c
# Opt level: O0

int check_cmf(FitsKey *pkey,FILE *out)

{
  FILE *out_local;
  FitsKey *pkey_local;
  
  if ((pkey->ktype == CMI_KEY) || (pkey->ktype == CMF_KEY)) {
    pkey_local._4_4_ = 1;
  }
  else {
    sprintf(errmes,"Keyword #%d, %s: value = %s is not a floating point complex number.",
            (ulong)(uint)pkey->kindex,pkey,pkey->kvalue);
    if (pkey->ktype == STR_KEY) {
      strcat(errmes," The value is entered as a string. ");
    }
    wrterr(out,errmes,1);
    pkey_local._4_4_ = 0;
  }
  return pkey_local._4_4_;
}

Assistant:

int check_cmf(FitsKey* pkey, FILE *out) 
{
    if(pkey->ktype != CMI_KEY && pkey->ktype != CMF_KEY) { 
        sprintf(errmes,
           "Keyword #%d, %s: value = %s is not a floating point complex number.",
        pkey->kindex,pkey->kname, pkey->kvalue);
	if(pkey->ktype == STR_KEY)  
	   strcat(errmes," The value is entered as a string. "); 
        wrterr(out,errmes,1); 
        return 0;
    } 
    return 1;
}